

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::
    sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              (uint64_t param_1,float *param_2,undefined8 param_3,int *param_4)

{
  bool bVar1;
  reference pfVar2;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_1;
  uint32_t i;
  float sum;
  bool index_found;
  float draw;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf;
  float total;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffff98
  ;
  float in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar3;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_58;
  int local_50;
  float local_4c;
  byte local_45;
  float local_44;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_40;
  float local_34;
  int *local_30;
  uint64_t local_28;
  undefined8 local_18;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_10 [2];
  
  local_30 = param_4;
  local_28 = param_1;
  local_18 = param_3;
  local_10[0]._M_current = param_2;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if ((bVar1) ||
     (bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98), bVar1)) {
    return 1;
  }
  local_34 = 0.0;
  local_40._M_current = local_10[0]._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98), bVar1) {
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_40);
    if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
      pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_40);
      *pfVar2 = 0.0;
    }
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_40);
    local_34 = *pfVar2 + local_34;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_40);
  }
  if ((local_34 == 0.0) && (!NAN(local_34))) {
    *local_30 = 0;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(local_10);
    *pfVar2 = 1.0;
    return 0;
  }
  fVar3 = local_34;
  local_44 = uniform_random_merand48(local_28);
  local_44 = fVar3 * local_44;
  if (local_34 < local_44) {
    local_44 = local_34;
  }
  local_45 = 0;
  local_4c = 0.0;
  local_50 = 0;
  local_58._M_current = local_10[0]._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                             *)CONCAT44(fVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98),
        bVar1) {
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_58);
    local_4c = *pfVar2 + local_4c;
    if (((local_45 & 1) == 0) && (local_44 < local_4c)) {
      *local_30 = local_50;
      local_45 = 1;
    }
    in_stack_ffffffffffffffa0 = local_34;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_58);
    *pfVar2 = *pfVar2 / in_stack_ffffffffffffffa0;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_58);
    local_50 = local_50 + 1;
  }
  if ((local_45 & 1) == 0) {
    *local_30 = local_50 + -1;
  }
  return 0;
}

Assistant:

int sample_after_normalizing(uint64_t seed, It pdf_first, It pdf_last, uint32_t& chosen_index, std::input_iterator_tag /* pdf_category */)
  {
    if (pdf_first == pdf_last || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;
    // Create a discrete_distribution based on the returned weights. This class handles the
    // case where the sum of the weights is < or > 1, by normalizing agains the sum.
    float total = 0.f;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf)
    {
      if (*pdf < 0)
        *pdf = 0;

      total += *pdf;
    }

    // assume the first is the best
    if (total == 0)
    {
      chosen_index = 0;
      *pdf_first = 1;
      return S_EXPLORATION_OK;
    }

    float draw = total * uniform_random_merand48(seed);
    if (draw > total) //make very sure that draw can not be greater than total.
      draw = total;

    bool index_found = false; //found chosen action
    float sum = 0.f;
    uint32_t i = 0;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf, ++i)
    {
      sum += *pdf;
      if (!index_found && sum > draw)
      {
        chosen_index = i;
        index_found = true;
      }
      *pdf /= total;
    }

    if(!index_found)
      chosen_index = i - 1;

    return S_EXPLORATION_OK;
  }